

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O3

value * mjs::anon_unknown_33::get_property_names
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,value *o,
                  bool check_enumerable)

{
  value *v;
  object *this;
  void *pvVar1;
  long *plVar2;
  value *extraout_RAX;
  uint32_t index;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  object_ptr a;
  vector<mjs::string,_std::allocator<mjs::string>_> n;
  gc_heap_ptr_untyped local_d8;
  wstring local_c8;
  gc_heap *local_a8;
  wstring_view local_a0;
  vector<mjs::string,_std::allocator<mjs::string>_> local_90;
  undefined1 local_78 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_70;
  gc_heap_ptr_untyped local_50;
  
  v = (value *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (o->type_ == object) {
    this = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(o->field_1).s_);
    object::own_property_names(&local_90,this,check_enumerable);
    uVar5 = (ulong)((long)local_90.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4;
    make_array((gc_heap_ptr<mjs::global_object> *)&local_d8,(uint32_t)global);
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if ((int)uVar5 != 0) {
      local_a8 = *(gc_heap **)((long)pvVar1 + 8);
      lVar4 = 8;
      uVar3 = 0;
      do {
        plVar2 = (long *)gc_heap_ptr_untyped::get(&local_d8);
        index_string_abi_cxx11_(&local_c8,(mjs *)(uVar3 & 0xffffffff),index);
        local_a0._M_len = local_c8._M_string_length;
        local_a0._M_str = local_c8._M_dataplus._M_p;
        string::string((string *)&local_50,local_a8,&local_a0);
        local_78._0_4_ = string;
        local_70.n_ = (double)*(undefined8 *)
                               ((long)local_90.
                                      super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
        local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             *(uint32_t *)
              ((long)&((local_90.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_gc_heap_ptr<mjs::gc_string>
                      ).super_gc_heap_ptr_untyped.heap_ + lVar4);
        if (local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
            (gc_heap *)0x0) {
          gc_heap::attach(local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                          heap_,(gc_heap_ptr_untyped *)(local_78 + 8));
        }
        (**(code **)(*plVar2 + 8))(plVar2,&local_50,(value *)local_78,0);
        value::destroy((value *)local_78);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while ((uVar5 & 0xffffffff) != uVar3);
    }
    __return_storage_ptr__->type_ = object;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_d8.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_90);
    return extraout_RAX;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value get_property_names(const gc_heap_ptr<global_object>& global, const value& o, bool check_enumerable) {
    global->validate_object(o);
    const auto n = o.object_value()->own_property_names(check_enumerable);
    const auto ns = static_cast<uint32_t>(n.size());
    auto a = make_array(global, ns);
    auto& h = global->heap();
    for (uint32_t i = 0; i < ns; ++i) {
        a->put(string{h,index_string(i)}, value{n[i]});
    }
    return value{a};
}